

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O2

void __thiscall SW2048Game::SW2048Game(SW2048Game *this,int order)

{
  ProcessingQueue *this_00;
  
  this->MAX = 0x4000;
  this_00 = (ProcessingQueue *)operator_new(0x18);
  ProcessingQueue::ProcessingQueue(this_00,order);
  this->processQueue = this_00;
  this->order = order;
  (this->blankList).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blankList).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blankList).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->playing = false;
  allocBoard(this);
  return;
}

Assistant:

SW2048Game::SW2048Game(int order) : order(order), processQueue(new ProcessingQueue(order))
{
	playing = false;
	allocBoard();
}